

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS ref_gather_tec_part(REF_GRID ref_grid,char *filename)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  uint uVar1;
  FILE *__s;
  REF_DBL *scalar;
  long lVar2;
  undefined8 uVar3;
  ulong uVar4;
  char *pcVar5;
  REF_GLOB *l2c;
  REF_LONG ncell;
  REF_GLOB nnode;
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  uVar1 = ref_node_synchronize_globals(ref_node);
  if (uVar1 == 0) {
    uVar1 = ref_grid_compact_cell_nodes(ref_grid,ref_cell,&nnode,&ncell,&l2c);
    if (uVar1 != 0) {
      uVar4 = (ulong)uVar1;
      pcVar5 = "l2c";
      uVar3 = 0x412;
      goto LAB_0011f645;
    }
    if (ref_grid->mpi->id == 0) {
      __s = fopen(filename,"w");
      if (__s == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        pcVar5 = "unable to open file";
        uVar3 = 0x418;
        goto LAB_0011f80a;
      }
      fwrite("title=\"tecplot refine partition file\"\n",0x26,1,__s);
      fwrite("variables = \"x\" \"y\" \"z\" \"p\" \"a\"\n",0x20,1,__s);
      fprintf(__s,"zone t=\"surf\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",nnode,
              ncell,"point","fetriangle");
    }
    else {
      __s = (FILE *)0x0;
    }
    uVar1 = ref_node->max;
    if ((int)uVar1 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x423,"ref_gather_tec_part","malloc scalar of REF_DBL negative");
      return 1;
    }
    scalar = (REF_DBL *)malloc((ulong)uVar1 << 4);
    if (scalar == (REF_DBL *)0x0) {
      pcVar5 = "malloc scalar of REF_DBL NULL";
      uVar3 = 0x423;
LAB_0011f80a:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar3,"ref_gather_tec_part",pcVar5);
      return 2;
    }
    for (lVar2 = 0; (ulong)uVar1 * 2 != lVar2; lVar2 = lVar2 + 2) {
      if (-1 < *(long *)((long)ref_node->global + lVar2 * 4)) {
        scalar[lVar2] = (double)*(int *)((long)ref_node->part + lVar2 * 2);
        scalar[lVar2 + 1] = (double)*(int *)((long)ref_node->age + lVar2 * 2);
      }
    }
    uVar1 = ref_gather_node_tec_part(ref_node,nnode,l2c,2,scalar,(FILE *)__s);
    if (uVar1 == 0) {
      uVar1 = ref_gather_cell_tec(ref_node,ref_cell,ncell,l2c,0,(FILE *)__s);
      if (uVar1 == 0) {
        if (ref_grid->mpi->id == 0) {
          fclose(__s);
        }
        free(scalar);
        free(l2c);
        return 0;
      }
      uVar4 = (ulong)uVar1;
      pcVar5 = "nodes";
      uVar3 = 0x42b;
    }
    else {
      uVar4 = (ulong)uVar1;
      pcVar5 = "nodes";
      uVar3 = 0x429;
    }
  }
  else {
    uVar4 = (ulong)uVar1;
    pcVar5 = "sync";
    uVar3 = 0x40f;
  }
LAB_0011f645:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar3,
         "ref_gather_tec_part",uVar4,pcVar5);
  return (REF_STATUS)uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_gather_tec_part(REF_GRID ref_grid,
                                       const char *filename) {
  FILE *file;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT node;
  REF_GLOB nnode, *l2c;
  REF_LONG ncell;
  REF_DBL *scalar;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    fprintf(file, "title=\"tecplot refine partition file\"\n");
    fprintf(file, "variables = \"x\" \"y\" \"z\" \"p\" \"a\"\n");
    fprintf(file,
            "zone t=\"surf\", nodes=" REF_GLOB_FMT
            ", elements=%ld, datapacking=%s, "
            "zonetype=%s\n",
            nnode, ncell, "point", "fetriangle");
  }

  ref_malloc(scalar, 2 * ref_node_max(ref_node), REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    scalar[0 + 2 * node] = (REF_DBL)ref_node_part(ref_node, node);
    scalar[1 + 2 * node] = (REF_DBL)ref_node_age(ref_node, node);
  }

  RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, 2, scalar, file), "nodes");
  RSS(ref_gather_cell_tec(ref_node, ref_cell, ncell, l2c, REF_FALSE, file),
      "nodes");

  if (ref_grid_once(ref_grid)) fclose(file);

  ref_free(scalar);
  ref_free(l2c);

  return REF_SUCCESS;
}